

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_add_settings
              (nghttp2_session *session,uint8_t flags,nghttp2_settings_entry *iv,size_t niv)

{
  int iVar1;
  byte local_69;
  nghttp2_inflight_settings *pnStack_68;
  uint8_t no_rfc7540_pri;
  nghttp2_inflight_settings *inflight_settings;
  nghttp2_mem *mem;
  nghttp2_outbound_item *pnStack_50;
  int rv;
  size_t i;
  nghttp2_settings_entry *iv_copy;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  size_t niv_local;
  nghttp2_settings_entry *iv_local;
  nghttp2_session *pnStack_18;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  pnStack_68 = (nghttp2_inflight_settings *)0x0;
  local_69 = session->pending_no_rfc7540_priorities;
  inflight_settings = (nghttp2_inflight_settings *)&session->mem;
  if ((flags & 1) != 0) {
    if (niv != 0) {
      return -0x1f5;
    }
    if (session->max_outbound_ack <= session->obq_flood_counter_) {
      return -0x388;
    }
  }
  item = (nghttp2_outbound_item *)niv;
  niv_local = (size_t)iv;
  iv_local._7_1_ = flags;
  pnStack_18 = session;
  iVar1 = nghttp2_iv_check(iv,niv);
  if (iVar1 == 0) {
    session_local._4_4_ = -0x1f5;
  }
  else {
    for (pnStack_50 = (nghttp2_outbound_item *)0x0; pnStack_50 < item;
        pnStack_50 = (nghttp2_outbound_item *)((long)&(pnStack_50->frame).data.hd.length + 1)) {
      if (*(int *)(niv_local + (long)pnStack_50 * 8) == 9) {
        if (local_69 == 0xff) {
          local_69 = (byte)*(undefined4 *)(niv_local + 4 + (long)pnStack_50 * 8);
        }
        else if (*(uint *)(niv_local + 4 + (long)pnStack_50 * 8) != (uint)local_69) {
          return -0x1f5;
        }
      }
    }
    frame = (nghttp2_frame *)nghttp2_mem_malloc((nghttp2_mem *)inflight_settings,0x98);
    if (frame == (nghttp2_frame *)0x0) {
      session_local._4_4_ = -0x385;
    }
    else {
      if (item == (nghttp2_outbound_item *)0x0) {
        i = 0;
      }
      else {
        i = (size_t)nghttp2_frame_iv_copy
                              ((nghttp2_settings_entry *)niv_local,(size_t)item,
                               (nghttp2_mem *)inflight_settings);
        if ((nghttp2_settings_entry *)i == (nghttp2_settings_entry *)0x0) {
          nghttp2_mem_free((nghttp2_mem *)inflight_settings,frame);
          return -0x385;
        }
      }
      if ((iv_local._7_1_ & 1) == 0) {
        mem._4_4_ = inflight_settings_new
                              (&stack0xffffffffffffff98,(nghttp2_settings_entry *)niv_local,
                               (size_t)item,(nghttp2_mem *)inflight_settings);
        if (mem._4_4_ != 0) {
          iVar1 = nghttp2_is_fatal(mem._4_4_);
          if (iVar1 != 0) {
            nghttp2_mem_free((nghttp2_mem *)inflight_settings,(void *)i);
            nghttp2_mem_free((nghttp2_mem *)inflight_settings,frame);
            return mem._4_4_;
          }
          __assert_fail("nghttp2_is_fatal(rv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                        ,0x1dcf,
                        "int nghttp2_session_add_settings(nghttp2_session *, uint8_t, const nghttp2_settings_entry *, size_t)"
                       );
        }
        mem._4_4_ = 0;
      }
      nghttp2_outbound_item_init((nghttp2_outbound_item *)&frame->hd);
      iv_copy = (nghttp2_settings_entry *)&frame->hd;
      nghttp2_frame_settings_init
                (&frame->settings,iv_local._7_1_,(nghttp2_settings_entry *)i,(size_t)item);
      mem._4_4_ = nghttp2_session_add_item(pnStack_18,(nghttp2_outbound_item *)&frame->hd);
      if (mem._4_4_ == 0) {
        if ((iv_local._7_1_ & 1) == 0) {
          session_append_inflight_settings(pnStack_18,pnStack_68);
        }
        else {
          pnStack_18->obq_flood_counter_ = pnStack_18->obq_flood_counter_ + 1;
        }
        for (pnStack_50 = item; pnStack_50 != (nghttp2_outbound_item *)0x0;
            pnStack_50 = (nghttp2_outbound_item *)&pnStack_50[-1].field_0x97) {
          if (*(int *)(niv_local + (long)&pnStack_50[-1].field_0x97 * 8) == 3) {
            pnStack_18->pending_local_max_concurrent_stream =
                 *(uint32_t *)(niv_local + 4 + (long)&pnStack_50[-1].field_0x97 * 8);
            break;
          }
        }
        for (pnStack_50 = item; pnStack_50 != (nghttp2_outbound_item *)0x0;
            pnStack_50 = (nghttp2_outbound_item *)&pnStack_50[-1].field_0x97) {
          if (*(int *)(niv_local + (long)&pnStack_50[-1].field_0x97 * 8) == 2) {
            pnStack_18->pending_enable_push =
                 (uint8_t)*(undefined4 *)(niv_local + 4 + (long)&pnStack_50[-1].field_0x97 * 8);
            break;
          }
        }
        for (pnStack_50 = item; pnStack_50 != (nghttp2_outbound_item *)0x0;
            pnStack_50 = (nghttp2_outbound_item *)&pnStack_50[-1].field_0x97) {
          if (*(int *)(niv_local + (long)&pnStack_50[-1].field_0x97 * 8) == 8) {
            pnStack_18->pending_enable_connect_protocol =
                 (uint8_t)*(undefined4 *)(niv_local + 4 + (long)&pnStack_50[-1].field_0x97 * 8);
            break;
          }
        }
        if (local_69 == 0xff) {
          pnStack_18->pending_no_rfc7540_priorities = '\0';
        }
        else {
          pnStack_18->pending_no_rfc7540_priorities = local_69;
        }
        session_local._4_4_ = 0;
      }
      else {
        iVar1 = nghttp2_is_fatal(mem._4_4_);
        if (iVar1 == 0) {
          __assert_fail("nghttp2_is_fatal(rv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                        ,0x1dde,
                        "int nghttp2_session_add_settings(nghttp2_session *, uint8_t, const nghttp2_settings_entry *, size_t)"
                       );
        }
        inflight_settings_del(pnStack_68,(nghttp2_mem *)inflight_settings);
        nghttp2_frame_settings_free((nghttp2_settings *)iv_copy,(nghttp2_mem *)inflight_settings);
        nghttp2_mem_free((nghttp2_mem *)inflight_settings,frame);
        session_local._4_4_ = mem._4_4_;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_add_settings(nghttp2_session *session, uint8_t flags,
                                 const nghttp2_settings_entry *iv, size_t niv) {
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_settings_entry *iv_copy;
  size_t i;
  int rv;
  nghttp2_mem *mem;
  nghttp2_inflight_settings *inflight_settings = NULL;
  uint8_t no_rfc7540_pri = session->pending_no_rfc7540_priorities;

  mem = &session->mem;

  if (flags & NGHTTP2_FLAG_ACK) {
    if (niv != 0) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    if (session->obq_flood_counter_ >= session->max_outbound_ack) {
      return NGHTTP2_ERR_FLOODED;
    }
  }

  if (!nghttp2_iv_check(iv, niv)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  for (i = 0; i < niv; ++i) {
    if (iv[i].settings_id != NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES) {
      continue;
    }

    if (no_rfc7540_pri == UINT8_MAX) {
      no_rfc7540_pri = (uint8_t)iv[i].value;
      continue;
    }

    if (iv[i].value != (uint32_t)no_rfc7540_pri) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  if (niv > 0) {
    iv_copy = nghttp2_frame_iv_copy(iv, niv, mem);
    if (iv_copy == NULL) {
      nghttp2_mem_free(mem, item);
      return NGHTTP2_ERR_NOMEM;
    }
  } else {
    iv_copy = NULL;
  }

  if ((flags & NGHTTP2_FLAG_ACK) == 0) {
    rv = inflight_settings_new(&inflight_settings, iv, niv, mem);
    if (rv != 0) {
      assert(nghttp2_is_fatal(rv));
      nghttp2_mem_free(mem, iv_copy);
      nghttp2_mem_free(mem, item);
      return rv;
    }
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_settings_init(&frame->settings, flags, iv_copy, niv);
  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    /* The only expected error is fatal one */
    assert(nghttp2_is_fatal(rv));

    inflight_settings_del(inflight_settings, mem);

    nghttp2_frame_settings_free(&frame->settings, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  if (flags & NGHTTP2_FLAG_ACK) {
    ++session->obq_flood_counter_;
  } else {
    session_append_inflight_settings(session, inflight_settings);
  }

  /* Extract NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS and ENABLE_PUSH
     here.  We use it to refuse the incoming stream and PUSH_PROMISE
     with RST_STREAM. */

  for (i = niv; i > 0; --i) {
    if (iv[i - 1].settings_id == NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS) {
      session->pending_local_max_concurrent_stream = iv[i - 1].value;
      break;
    }
  }

  for (i = niv; i > 0; --i) {
    if (iv[i - 1].settings_id == NGHTTP2_SETTINGS_ENABLE_PUSH) {
      session->pending_enable_push = (uint8_t)iv[i - 1].value;
      break;
    }
  }

  for (i = niv; i > 0; --i) {
    if (iv[i - 1].settings_id == NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL) {
      session->pending_enable_connect_protocol = (uint8_t)iv[i - 1].value;
      break;
    }
  }

  if (no_rfc7540_pri == UINT8_MAX) {
    session->pending_no_rfc7540_priorities = 0;
  } else {
    session->pending_no_rfc7540_priorities = no_rfc7540_pri;
  }

  return 0;
}